

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXImporter.cpp
# Opt level: O2

void __thiscall
Assimp::FBXImporter::InternReadFile
          (FBXImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  pointer input;
  int iVar1;
  undefined4 extraout_var;
  long lVar3;
  FileGlobalSettings *this_00;
  float fVar4;
  TokenList tokens;
  vector<char,_std::allocator<char>_> contents;
  Parser parser;
  Document doc;
  long *plVar2;
  
  std::__cxx11::string::string((string *)&doc,"rb",(allocator *)&parser);
  iVar1 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,doc.settings);
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  std::__cxx11::string::~string((string *)&doc);
  if (plVar2 == (long *)0x0) {
    std::__cxx11::string::string
              ((string *)&doc,"Could not open file for reading",(allocator *)&parser);
    LogFunctions<Assimp::FBXImporter>::ThrowException((string *)&doc);
    std::__cxx11::string::~string((string *)&doc);
  }
  contents.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  contents.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  contents.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lVar3 = (**(code **)(*plVar2 + 0x30))(plVar2);
  std::vector<char,_std::allocator<char>_>::resize(&contents,lVar3 + 1);
  (**(code **)(*plVar2 + 0x10))
            (plVar2,contents.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,1,
             contents.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish +
             ~(ulong)contents.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start);
  input = contents.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start;
  contents.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
  [-1] = '\0';
  tokens.super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tokens.super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tokens.super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = strncmp(contents.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,"Kaydara FBX Binary",0x12);
  if (iVar1 == 0) {
    FBX::TokenizeBinary(&tokens,input,
                        (long)contents.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)input);
  }
  else {
    FBX::Tokenize(&tokens,input);
  }
  FBX::Parser::Parser(&parser,&tokens,iVar1 == 0);
  FBX::Document::Document(&doc,&parser,&this->settings);
  FBX::ConvertToAssimpScene(pScene,&doc,(this->settings).removeEmptyBones);
  this_00 = FBX::Document::GlobalSettings(&doc);
  fVar4 = FBX::FileGlobalSettings::UnitScaleFactor(this_00);
  (*(this->super_BaseImporter)._vptr_BaseImporter[6])(SUB84((double)(fVar4 * 0.01),0),this);
  std::
  for_each<__gnu_cxx::__normal_iterator<Assimp::FBX::Token_const**,std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>>,Assimp::FBX::Util::delete_fun<Assimp::FBX::Token>>
            (tokens.
             super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
             ._M_impl.super__Vector_impl_data._M_start,
             tokens.
             super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  FBX::Document::~Document(&doc);
  FBX::Parser::~Parser(&parser);
  std::_Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
  ~_Vector_base(&tokens.
                 super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
               );
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&contents.super__Vector_base<char,_std::allocator<char>_>);
  (**(code **)(*plVar2 + 8))(plVar2);
  return;
}

Assistant:

void FBXImporter::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> stream(pIOHandler->Open(pFile,"rb"));
    if (!stream) {
        ThrowException("Could not open file for reading");
    }

    // read entire file into memory - no streaming for this, fbx
    // files can grow large, but the assimp output data structure
    // then becomes very large, too. Assimp doesn't support
    // streaming for its output data structures so the net win with
    // streaming input data would be very low.
    std::vector<char> contents;
    contents.resize(stream->FileSize()+1);
    stream->Read( &*contents.begin(), 1, contents.size()-1 );
    contents[ contents.size() - 1 ] = 0;
    const char* const begin = &*contents.begin();

    // broadphase tokenizing pass in which we identify the core
    // syntax elements of FBX (brackets, commas, key:value mappings)
    TokenList tokens;
    try {

        bool is_binary = false;
        if (!strncmp(begin,"Kaydara FBX Binary",18)) {
            is_binary = true;
            TokenizeBinary(tokens,begin,contents.size());
        }
        else {
            Tokenize(tokens,begin);
        }

        // use this information to construct a very rudimentary
        // parse-tree representing the FBX scope structure
        Parser parser(tokens, is_binary);

        // take the raw parse-tree and convert it to a FBX DOM
        Document doc(parser,settings);

        // convert the FBX DOM to aiScene
        ConvertToAssimpScene(pScene, doc, settings.removeEmptyBones);

        // size relative to cm
        float size_relative_to_cm = doc.GlobalSettings().UnitScaleFactor();

        // Set FBX file scale is relative to CM must be converted to M for
        // assimp universal format (M)
        SetFileScale( size_relative_to_cm * 0.01f);

        std::for_each(tokens.begin(),tokens.end(),Util::delete_fun<Token>());
    }
    catch(std::exception&) {
        std::for_each(tokens.begin(),tokens.end(),Util::delete_fun<Token>());
        throw;
    }
}